

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O3

Am_Object do_search_backward(Am_Value_List *parts,Am_Value_List *old_sel_list,
                            Am_Value_List *slots_and_values_used)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Wrapper *value;
  ostream *poVar4;
  Am_Value_List *in_RCX;
  Am_Object *prev;
  Am_Object object;
  Am_Object local_38;
  
  Am_Value_List::End(old_sel_list);
  local_38.data = (Am_Object_Data *)0x0;
  bVar1 = Am_Value_List::Valid(slots_and_values_used);
  if (bVar1) {
    iVar2 = -1;
    while (bVar1 = Am_Value_List::First(old_sel_list), !bVar1) {
      pAVar3 = Am_Value_List::Get(old_sel_list);
      Am_Object::operator=(&local_38,pAVar3);
      value = Am_Object::operator_cast_to_Am_Wrapper_(&local_38);
      bVar1 = Am_Value_List::Start_Member(slots_and_values_used,value);
      if (bVar1) {
        iVar2 = Am_Value_List::Nth(old_sel_list);
      }
      Am_Value_List::Prev(old_sel_list);
    }
    if (iVar2 == 0) {
      Am_Object::Am_Object((Am_Object *)parts,&Am_No_Object);
      goto LAB_00210998;
    }
    if (iVar2 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Lost old value ",0xf);
      poVar4 = operator<<((ostream *)&std::cerr,slots_and_values_used);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," from parts list for selection widget ",0x26);
      poVar4 = operator<<(poVar4,old_sel_list);
      std::endl<char,std::char_traits<char>>(poVar4);
      Am_Error();
    }
    Am_Value_List::Move_Nth(old_sel_list,iVar2 + -1);
  }
  while (bVar1 = Am_Value_List::First(old_sel_list), prev = &Am_No_Object, !bVar1) {
    pAVar3 = Am_Value_List::Get(old_sel_list);
    Am_Object::operator=(&local_38,pAVar3);
    bVar1 = test_match_object(&local_38,in_RCX);
    prev = &local_38;
    if (bVar1) break;
    Am_Value_List::Prev(old_sel_list);
  }
  Am_Object::Am_Object((Am_Object *)parts,prev);
LAB_00210998:
  Am_Object::~Am_Object(&local_38);
  return (Am_Object)(Am_Object_Data *)parts;
}

Assistant:

Am_Object
do_search_backward(Am_Value_List &parts, Am_Value_List &old_sel_list,
                   Am_Value_List &slots_and_values_used)
{
  //move parts list to the first selected part
  parts.End();
  Am_Object object;
  if (old_sel_list.Valid()) {
    int index = -1;
    for (; !parts.First(); parts.Prev()) {
      object = parts.Get();
      if (old_sel_list.Start_Member(object))
        index = parts.Nth();
    }
    if (index == -1)
      Am_ERROR("Lost old value " << old_sel_list
                                 << " from parts list for selection widget "
                                 << parts);
    if (index == 0) { //already at beginning
      return Am_No_Object;
    }
    parts.Move_Nth(index - 1);
  }
  //now search forward for new object
  for (; !parts.First(); parts.Prev()) {
    object = parts.Get();
    if (test_match_object(object, slots_and_values_used))
      return object;
  }
  return Am_No_Object;
}